

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::Analyzer::addReferences(Analyzer *this,Expression *curr)

{
  bool bVar1;
  Module **this_00;
  reference ppVar2;
  type *ptVar3;
  type *ptVar4;
  Global *this_01;
  pointer *this_02;
  reference pNVar5;
  ModuleElementKind local_224;
  pair<wasm::ModuleElementKind,_wasm::Name> local_220;
  undefined1 auStack_208 [8];
  Name func;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_1f0;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2_1;
  Global *global;
  type *value;
  type *kind;
  undefined1 auStack_198 [8];
  pair<wasm::ModuleElementKind,_wasm::Name> element;
  __normal_iterator<std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
  local_178;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  *__range2;
  undefined1 local_150 [8];
  ReferenceFinder finder;
  Expression *curr_local;
  Analyzer *this_local;
  
  finder.structFields.
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  ReferenceFinder::ReferenceFinder((ReferenceFinder *)local_150);
  Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::setModule
            ((Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_> *)local_150
             ,this->module);
  Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::walk
            ((Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_> *)local_150
             ,(Expression **)
              &finder.structFields.
               super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &finder.
             super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
             super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
             currModule;
  __end2 = std::
           vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
           ::begin((vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                    *)this_00);
  local_178._M_current =
       (pair<wasm::ModuleElementKind,_wasm::Name> *)
       std::
       vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
       ::end((vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
              *)this_00);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_178), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
             ::operator*(&__end2);
    element.second.super_IString.str._M_len = (size_t)(ppVar2->second).super_IString.str._M_str;
    auStack_198._0_4_ = ppVar2->first;
    auStack_198._4_4_ = *(undefined4 *)&ppVar2->field_0x4;
    element._0_8_ = (ppVar2->second).super_IString.str._M_len;
    std::
    unordered_set<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
    ::insert(&this->referenced,(value_type *)auStack_198);
    ptVar3 = std::get<0ul,wasm::ModuleElementKind,wasm::Name>
                       ((pair<wasm::ModuleElementKind,_wasm::Name> *)auStack_198);
    ptVar4 = std::get<1ul,wasm::ModuleElementKind,wasm::Name>
                       ((pair<wasm::ModuleElementKind,_wasm::Name> *)auStack_198);
    if (*ptVar3 == Global) {
      this_01 = Module::getGlobal(this->module,(Name)(ptVar4->super_IString).str);
      bVar1 = Importable::imported(&this_01->super_Importable);
      if (!bVar1) {
        addReferences(this,this_01->init);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
    ::operator++(&__end2);
  }
  this_02 = &finder.callRefTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                       ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)this_02);
  local_1f0._M_current =
       (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)this_02);
  while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&local_1f0), bVar1) {
    pNVar5 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2_1);
    auStack_208 = (undefined1  [8])(pNVar5->super_IString).str._M_len;
    func.super_IString.str._M_len = (size_t)(pNVar5->super_IString).str._M_str;
    local_224 = Function;
    std::pair<wasm::ModuleElementKind,_wasm::Name>::
    pair<wasm::ModuleElementKind,_wasm::Name_&,_true>(&local_220,&local_224,(Name *)auStack_208);
    std::
    unordered_set<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
    ::insert(&this->referenced,&local_220);
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2_1);
  }
  ReferenceFinder::~ReferenceFinder((ReferenceFinder *)local_150);
  return;
}

Assistant:

void addReferences(Expression* curr) {
    // Find references anywhere in this expression so we can apply them.
    ReferenceFinder finder;
    finder.setModule(module);
    finder.walk(curr);

    for (auto element : finder.elements) {
      referenced.insert(element);

      auto& [kind, value] = element;
      if (kind == ModuleElementKind::Global) {
        // Like functions, (non-imported) globals have contents. For functions,
        // things are simple: if a function ends up with references but no uses
        // then we can simply empty out the function (by setting its body to an
        // unreachable). We don't have a simple way to do the same for globals,
        // unfortunately. For now, scan the global's contents and add references
        // as needed.
        // TODO: We could try to empty the global out, for example, replace it
        //       with a null if it is nullable, or replace all gets of it with
        //       something else, but that is not trivial.
        auto* global = module->getGlobal(value);
        if (!global->imported()) {
          // Note that infinite recursion is not a danger here since a global
          // can only refer to previous globals.
          addReferences(global->init);
        }
      }
    }

    for (auto func : finder.refFuncs) {
      // If a function ends up referenced but not used then later down we will
      // empty it out by replacing its body with an unreachable, which always
      // validates. For that reason all we need to do here is mark the function
      // as referenced - we don't need to do anything with the body.
      //
      // Note that it is crucial that we do not call useRefFunc() here: we are
      // just adding a reference to the function, and not actually using the
      // RefFunc. (Only useRefFunc() + a CallRef of the proper type are enough
      // to make a function itself used.)
      referenced.insert({ModuleElementKind::Function, func});
    }

    // Note: nothing to do with |callRefTypes| and |structFields|, which only
    // involve types. This function only cares about references to module
    // elements like functions, globals, and tables. (References to types are
    // handled in an entirely different way in Binaryen IR, and we don't need to
    // worry about it.)
  }